

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

double class_matrix(int kind,int m,double alpha,double beta,double *aj,double *bj)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar13 = r8_epsilon();
  parchk(kind,m * 2 + -1,alpha,beta);
  dVar10 = r8_gamma(0.5);
  dVar10 = r8_abs(dVar10 * dVar10 + -3.141592653589793);
  if (dVar13 * 500.0 < dVar10) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CLASS_MATRIX - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Gamma function does not match machine parameters.\n");
    exit(1);
  }
  switch(kind) {
  case 1:
    uVar5 = 0;
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      aj[uVar5] = 0.0;
    }
    iVar7 = 2;
    for (uVar5 = 0; dVar13 = 2.0, uVar3 != uVar5; uVar5 = uVar5 + 1) {
      dVar13 = (double)((int)uVar5 + 1);
      dVar13 = (dVar13 * dVar13) / ((double)iVar7 * (double)iVar7 + -1.0);
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      bj[uVar5] = dVar13;
      iVar7 = iVar7 + 2;
    }
    break;
  case 2:
    uVar3 = 0;
    uVar5 = 0;
    if (0 < m) {
      uVar5 = (ulong)(uint)m;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      aj[uVar3] = 0.0;
    }
    *bj = 0.7071067811865476;
    dVar13 = 3.141592653589793;
    for (lVar6 = 1; lVar6 < m; lVar6 = lVar6 + 1) {
      bj[lVar6] = 0.5;
    }
    break;
  case 3:
    dVar10 = alpha + alpha;
    dVar8 = exp2(dVar10 + 1.0);
    dVar1 = r8_gamma(alpha + 1.0);
    dVar13 = r8_gamma(dVar10 + 2.0);
    uVar3 = 0;
    uVar5 = 0;
    if (0 < m) {
      uVar5 = (ulong)(uint)m;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      aj[uVar3] = 0.0;
    }
    dVar9 = 1.0 / (dVar10 + 3.0);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    *bj = dVar9;
    for (lVar6 = 2; lVar6 <= m; lVar6 = lVar6 + 1) {
      dVar9 = (double)(int)lVar6;
      dVar9 = ((dVar10 + dVar9) * dVar9) / ((dVar9 + alpha) * (dVar9 + alpha) * 4.0 + -1.0);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      bj[lVar6 + -1] = dVar9;
    }
    dVar13 = (dVar8 * dVar1 * dVar1) / dVar13;
    break;
  case 4:
    dVar10 = alpha + beta;
    dVar11 = dVar10 + 2.0;
    dVar8 = exp2(dVar10 + 1.0);
    dVar1 = r8_gamma(alpha + 1.0);
    dVar9 = r8_gamma(beta + 1.0);
    dVar13 = r8_gamma(dVar11);
    *aj = (beta - alpha) / dVar11;
    dVar11 = ((alpha + 1.0) * 4.0 * (beta + 1.0)) / ((dVar11 + 1.0) * dVar11 * dVar11);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    *bj = dVar11;
    for (lVar6 = 2; lVar6 <= m; lVar6 = lVar6 + 1) {
      dVar11 = (double)(int)lVar6;
      dVar12 = dVar11 + dVar11 + dVar10;
      aj[lVar6 + -1] = (beta * beta - alpha * alpha) / ((dVar12 + -2.0) * dVar12);
      dVar11 = ((dVar11 + beta) * (dVar11 + alpha) * dVar11 * 4.0 * (dVar10 + dVar11)) /
               ((dVar12 * dVar12 + -1.0) * dVar12 * dVar12);
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      bj[lVar6 + -1] = dVar11;
    }
    dVar13 = (dVar8 * dVar1 * dVar9) / dVar13;
    break;
  case 5:
    dVar13 = r8_gamma(alpha + 1.0);
    uVar5 = 0;
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      dVar8 = (double)((int)uVar5 + 1);
      dVar10 = (dVar8 + alpha) * dVar8;
      aj[uVar5] = dVar8 + dVar8 + -1.0 + alpha;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      bj[uVar5] = dVar10;
    }
    break;
  case 6:
    dVar13 = r8_gamma((alpha + 1.0) * 0.5);
    uVar5 = 0;
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      aj[uVar5] = 0.0;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = (int)uVar5 + 1;
      dVar10 = ((double)(uVar2 & 1) * alpha + (double)(int)uVar2) * 0.5;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      bj[uVar5] = dVar10;
    }
    break;
  case 7:
    uVar5 = 0;
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      aj[uVar5] = 0.0;
    }
    iVar7 = 2;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = (int)uVar5 + 1;
      dVar13 = (double)(uVar2 & 1) * alpha + (double)(int)uVar2;
      dVar13 = (dVar13 * dVar13) / (((double)iVar7 + alpha) * ((double)iVar7 + alpha) + -1.0);
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      bj[uVar5] = dVar13;
      iVar7 = iVar7 + 2;
    }
    dVar13 = 2.0 / (alpha + 1.0);
    break;
  case 8:
    dVar9 = alpha + beta;
    dVar10 = alpha + 1.0;
    dVar8 = r8_gamma(dVar10);
    dVar1 = r8_gamma(-(dVar9 + 1.0));
    dVar13 = r8_gamma(-beta);
    dVar11 = -dVar10 / (dVar9 + 2.0);
    *aj = dVar11;
    *bj = (((beta + 1.0) * -dVar11) / (dVar9 + 2.0)) / (dVar9 + 3.0);
    lVar4 = (long)m;
    for (lVar6 = 2; lVar6 <= lVar4; lVar6 = lVar6 + 1) {
      dVar11 = (double)(int)lVar6;
      dVar12 = dVar11 + dVar11 + dVar9;
      aj[lVar6 + -1] =
           (-((double)((int)lVar6 + -1) * (dVar9 + dVar11 + dVar9 + dVar11) + dVar10 * dVar9) /
           dVar12) / (dVar12 + -2.0);
    }
    for (lVar6 = 2; lVar6 < lVar4; lVar6 = lVar6 + 1) {
      dVar10 = (double)(int)lVar6;
      dVar11 = dVar10 + dVar10 + dVar9;
      bj[lVar6 + -1] =
           ((((dVar10 + beta) * (((dVar10 + alpha) * dVar10) / (dVar11 + -1.0))) / (dVar11 * dVar11)
            ) * (dVar9 + dVar10)) / (dVar11 + 1.0);
    }
    bj[lVar4 + -1] = 0.0;
    uVar5 = 0;
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      dVar10 = bj[uVar5];
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      bj[uVar5] = dVar10;
    }
    dVar13 = (dVar8 * dVar1) / dVar13;
    break;
  case 9:
    uVar5 = 0;
    uVar3 = (ulong)(uint)m;
    if (m < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      aj[uVar5] = 0.0;
    }
    dVar13 = 1.5707963267948966;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      bj[uVar5] = 0.5;
    }
    break;
  default:
    dVar13 = 0.0;
  }
  return dVar13;
}

Assistant:

double class_matrix ( int kind, int m, double alpha, double beta, double aj[], 
  double bj[] )

//****************************************************************************80
//
//  Purpose:
//
//    CLASS_MATRIX computes the Jacobi matrix for a quadrature rule.
//
//  Discussion:
//
//    This routine computes the diagonal AJ and sub-diagonal BJ
//    elements of the order M tridiagonal symmetric Jacobi matrix
//    associated with the polynomials orthogonal with respect to
//    the weight function specified by KIND.
//
//    For weight functions 1-7, M elements are defined in BJ even
//    though only M-1 are needed.  For weight function 8, BJ(M) is
//    set to zero.
//
//    The zero-th moment of the weight function is returned in ZEMU.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int KIND, the rule.
//    1, Legendre,             (a,b)       1.0
//    2, Chebyshev Type 1,     (a,b)       ((b-x)*(x-a))^(-0.5)
//    3, Gegenbauer,           (a,b)       ((b-x)*(x-a))^alpha
//    4, Jacobi,               (a,b)       (b-x)^alpha*(x-a)^beta
//    5, Generalized Laguerre, (a,+oo)     (x-a)^alpha*exp(-b*(x-a))
//    6, Generalized Hermite,  (-oo,+oo)   |x-a|^alpha*exp(-b*(x-a)^2)
//    7, Exponential,          (a,b)       |x-(a+b)/2.0|^alpha
//    8, Rational,             (a,+oo)     (x-a)^alpha*(x+b)^beta
//    9, Chebyshev Type 2,     (a,b)       ((b-x)*(x-a))^(+0.5)
//
//    Input, int M, the order of the Jacobi matrix.
//
//    Input, double ALPHA, the value of Alpha, if needed.
//
//    Input, double BETA, the value of Beta, if needed.
//
//    Output, double AJ[M], BJ[M], the diagonal and subdiagonal
//    of the Jacobi matrix.
//
//    Output, double CLASS_MATRIX, the zero-th moment.
//
{
  double a2b2;
  double ab;
  double aba;
  double abi;
  double abj;
  double abti;
  double apone;
  int i;
  double pi = 3.14159265358979323846264338327950;
  double temp;
  double temp2;
  double zemu = 0.0; // Uninitialized warning.

  temp = r8_epsilon ( );

  parchk ( kind, 2 * m - 1, alpha, beta );

  temp2 = 0.5;

  if ( 500.0 * temp < r8_abs ( pow ( r8_gamma ( temp2 ), 2 ) - pi ) )
  {
    std::cerr << "\n";
    std::cerr << "CLASS_MATRIX - Fatal error!\n";
    std::cerr << "  Gamma function does not match machine parameters.\n";
    exit ( 1 );
  }

  if ( kind == 1 )
  {
    ab = 0.0;

    zemu = 2.0 / ( ab + 1.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      abi = i + ab * ( i % 2 );
      abj = 2 * i + ab;
      bj[i-1] = sqrt ( abi * abi / ( abj * abj - 1.0 ) );
    }
  }
  else if ( kind == 2 )
  {
    zemu = pi;

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    bj[0] = sqrt ( 0.5 );
    for ( i = 1; i < m; i++ )
    {
      bj[i] = 0.5;
    }
  }
  else if ( kind == 3 )
  {
    ab = alpha * 2.0;
    zemu = pow ( 2.0, ab + 1.0 ) * pow ( r8_gamma ( alpha + 1.0 ), 2 )
      / r8_gamma ( ab + 2.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    bj[0] = sqrt ( 1.0 / ( 2.0 * alpha + 3.0 ) );
    for ( i = 2; i <= m; i++ )
    {
      bj[i-1] = sqrt ( i * ( i + ab ) / ( 4.0 * pow ( i + alpha, 2 ) - 1.0 ) );
    }
  }
  else if ( kind == 4 )
  {
    ab = alpha + beta;
    abi = 2.0 + ab;
    zemu = pow ( 2.0, ab + 1.0 ) * r8_gamma ( alpha + 1.0 ) 
      * r8_gamma ( beta + 1.0 ) / r8_gamma ( abi );
    aj[0] = ( beta - alpha ) / abi;
    bj[0] = sqrt ( 4.0 * ( 1.0 + alpha ) * ( 1.0 + beta ) 
      / ( ( abi + 1.0 ) * abi * abi ) );
    a2b2 = beta * beta - alpha * alpha;

    for ( i = 2; i <= m; i++ )
    {
      abi = 2.0 * i + ab;
      aj[i-1] = a2b2 / ( ( abi - 2.0 ) * abi );
      abi = abi * abi;
      bj[i-1] = sqrt ( 4.0 * i * ( i + alpha ) * ( i + beta ) * ( i + ab ) 
        / ( ( abi - 1.0 ) * abi ) );
    }
  }
  else if ( kind == 5 )
  {
    zemu = r8_gamma ( alpha + 1.0 );

    for ( i = 1; i <= m; i++ )
    {
      aj[i-1] = 2.0 * i - 1.0 + alpha;
      bj[i-1] = sqrt ( i * ( i + alpha ) );
    }
  }
  else if ( kind == 6 )
  {
    zemu = r8_gamma ( ( alpha + 1.0 ) / 2.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      bj[i-1] = sqrt ( ( i + alpha * ( i % 2 ) ) / 2.0 );
    }
  }
  else if ( kind == 7 )
  {
    ab = alpha;
    zemu = 2.0 / ( ab + 1.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      abi = i + ab * ( i % 2 );
      abj = 2 * i + ab;
      bj[i-1] = sqrt ( abi * abi / ( abj * abj - 1.0 ) );
    }
  }
  else if ( kind == 8 )
  {
    ab = alpha + beta;
    zemu = r8_gamma ( alpha + 1.0 ) * r8_gamma ( - ( ab + 1.0 ) ) 
      / r8_gamma ( - beta );
    apone = alpha + 1.0;
    aba = ab * apone;
    aj[0] = - apone / ( ab + 2.0 );
    bj[0] = - aj[0] * ( beta + 1.0 ) / ( ab + 2.0 ) / ( ab + 3.0 );
    for ( i = 2; i <= m; i++ )
    {
      abti = ab + 2.0 * i;
      aj[i-1] = aba + 2.0 * ( ab + i ) * ( i - 1 );
      aj[i-1] = - aj[i-1] / abti / ( abti - 2.0 );
    }

    for ( i = 2; i <= m - 1; i++ )
    {
      abti = ab + 2.0 * i;
      bj[i-1] = i * ( alpha + i ) / ( abti - 1.0 ) * ( beta + i ) 
        / ( abti * abti ) * ( ab + i ) / ( abti + 1.0 );
    }
    bj[m-1] = 0.0;
    for ( i = 0; i < m; i++ )
    {
      bj[i] = sqrt ( bj[i] );
    }
  }
  else if ( kind == 9 )
  {
    zemu = pi / 2.0;

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 0; i < m; i++ )
    {
      bj[i] = 0.5;
    }
  }

  return zemu;
}